

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
DensityCalculator<double,double>::initialize_bdens<InputData<double,int>>
          (DensityCalculator<double,_double> *this,InputData<double,_int> *input_data,
          ModelParams *model_params,vector<unsigned_long,_std::allocator<unsigned_long>_> *ix_arr,
          ColumnSampler<double> *col_sampler)

{
  undefined4 uVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  bool *unsplittable_00;
  reference pvVar5;
  char *col_00;
  reference pvVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  size_t *in_RDI;
  double dVar7;
  size_t col;
  vector<signed_char,_std::allocator<signed_char>_> categ_present;
  size_t npresent;
  bool unsplittable;
  size_t col_1;
  value_type_conflict *in_stack_fffffffffffffe98;
  ColumnSampler<double> *in_stack_fffffffffffffea0;
  undefined4 uVar8;
  ColumnSampler<double> *in_stack_fffffffffffffea8;
  ColumnSampler<double> *in_stack_fffffffffffffeb0;
  undefined1 *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  value_type in_stack_fffffffffffffecc;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  bool *in_stack_fffffffffffffef0;
  double *in_stack_ffffffffffffff00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  int *Xc_ind;
  double *Xc;
  size_t in_stack_ffffffffffffff60;
  value_type vVar9;
  size_t in_stack_ffffffffffffff68;
  vector<int,_std::allocator<int>_> *local_88;
  int *in_stack_ffffffffffffff80;
  MissingAction in_stack_ffffffffffffff88;
  double *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  bool *in_stack_ffffffffffffffa0;
  undefined1 local_58 [16];
  pointer local_48;
  pointer local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  size_t local_28;
  size_t local_20;
  
  *(byte *)(in_RDI + 0x12) = *(byte *)(in_RDX + 0x90) & 1;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  if ((in_RDI[0x12] & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffffed0,
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_40 = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
  }
  if ((*(long *)(local_20 + 0xc0) == 0) && (*(long *)(local_20 + 0xd0) == 0)) {
    if (*(long *)(local_20 + 8) != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                (in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      if ((in_RDI[0x12] & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      }
    }
    if (*(long *)(local_20 + 0x28) != 0) {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
    local_58[0xf] = 0;
    local_58._0_8_ = (pointer)0x0;
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x1feb68);
    if (*(long *)(local_20 + 0x28) != 0) {
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffec0,
                 (size_type)in_stack_fffffffffffffeb8);
    }
    ColumnSampler<double>::prepare_full_pass(in_stack_fffffffffffffeb0);
    while( true ) {
      bVar2 = ColumnSampler<double>::sample_col
                        (in_stack_fffffffffffffea8,(size_t *)in_stack_fffffffffffffea0);
      uVar8 = (undefined4)((ulong)in_stack_fffffffffffffea0 >> 0x20);
      if (!bVar2) break;
      if (local_88 < *(vector<int,_std::allocator<int>_> **)(local_20 + 8)) {
        if (*(long *)(local_20 + 0x68) == 0) {
          unsplittable_00 =
               (bool *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1fed3d)
          ;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30);
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(size_type)local_88);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),
                              (size_type)local_88);
          in_stack_fffffffffffffea0 = (ColumnSampler<double> *)(local_58 + 0xf);
          get_range<double>((size_t *)in_stack_fffffffffffffef0,
                            (double *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            (size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                            (MissingAction)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            (double *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                            in_stack_ffffffffffffff00,unsplittable_00);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1fec23);
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30);
          in_stack_ffffffffffffff38 = (vector<int,_std::allocator<int>_> *)(sVar4 - 1);
          Xc_ind = *(int **)(local_20 + 0x58);
          Xc = *(double **)(local_20 + 0x60);
          pvVar3 = *(reference *)(local_20 + 0x68);
          uVar1 = *(undefined4 *)(local_28 + 0x88);
          in_stack_ffffffffffffff40 = local_88;
          in_stack_fffffffffffffea8 =
               (ColumnSampler<double> *)
               std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),
                          (size_type)local_88);
          in_stack_fffffffffffffeb0 =
               (ColumnSampler<double> *)
               std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),
                          (size_type)local_88);
          in_stack_fffffffffffffeb8 = local_58 + 0xf;
          in_stack_fffffffffffffea0 = (ColumnSampler<double> *)CONCAT44(uVar8,uVar1);
          get_range<double,int>
                    (in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     (size_t)in_stack_fffffffffffffea8,Xc,Xc_ind,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffffa0);
        }
        if ((local_58[0xf] & 1) != 0) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),
                              (size_type)local_88);
          *pvVar5 = 0.0;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),
                              (size_type)local_88);
          *pvVar5 = 0.0;
          if ((in_RDI[0x12] & 1) == 0) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x13),
                                (size_type)local_88);
            *pvVar5 = 0.0;
          }
          ColumnSampler<double>::drop_col(in_stack_fffffffffffffea0,(size_t)pvVar3);
        }
        if ((in_RDI[0x12] & 1) == 0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),
                              (size_type)local_88);
          in_stack_fffffffffffffef0 = (bool *)*pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),
                              (size_type)local_88);
          dVar7 = (double)in_stack_fffffffffffffef0 - *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x13),
                              (size_type)local_88);
          *pvVar3 = dVar7;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x13),
                              (size_type)local_88);
          in_stack_ffffffffffffff00 = (double *)*pvVar3;
          if ((double)in_stack_ffffffffffffff00 <= 0.0) {
            in_stack_ffffffffffffff00 = (double *)0x0;
          }
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x13),
                              (size_type)local_88);
          *pvVar3 = (value_type)in_stack_ffffffffffffff00;
        }
      }
      else {
        in_stack_fffffffffffffed0 =
             (vector<double,_std::allocator<double>_> *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1fef9f);
        in_stack_fffffffffffffed8 =
             *(long *)(local_20 + 0x10) +
             *(long *)(local_20 + 0x30) * ((long)local_88 - *(long *)(local_20 + 8)) * 4;
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30);
        in_stack_fffffffffffffee0 = (char *)(sVar4 - 1);
        in_stack_fffffffffffffee8 = *(undefined4 *)(*(long *)(local_20 + 0x18) + (long)local_88 * 4)
        ;
        in_stack_fffffffffffffeec = *(undefined4 *)(local_28 + 0x88);
        col_00 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                           ((vector<signed_char,_std::allocator<signed_char>_> *)0x1ff030);
        in_stack_fffffffffffffea0 = (ColumnSampler<double> *)local_58;
        in_stack_fffffffffffffea8 = (ColumnSampler<double> *)(local_58 + 0xf);
        get_categs((size_t *)in_stack_fffffffffffffed0,
                   (int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (size_t)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                   (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   (MissingAction)in_stack_fffffffffffffeb0,in_stack_fffffffffffffee0,
                   (size_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffef0);
        if ((local_58[0xf] & 1) == 0) {
          in_stack_fffffffffffffecc = (value_type)local_58._0_8_;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x16),
                              (long)local_88 - *(long *)(local_20 + 8));
          *pvVar6 = in_stack_fffffffffffffecc;
        }
        else {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x16),
                              (long)local_88 - *(long *)(local_20 + 8));
          *pvVar6 = 1;
          ColumnSampler<double>::drop_col(in_stack_fffffffffffffea0,(size_t)col_00);
        }
      }
    }
    if ((in_RDI[0x12] & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffeb0);
  }
  else {
    if (*(long *)(local_20 + 8) != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                (in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::vector<double,std::allocator<double>>::assign<double*,void>
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffeb0,
                 (double *)in_stack_fffffffffffffea8,(double *)in_stack_fffffffffffffea0);
      std::vector<double,std::allocator<double>>::assign<double*,void>
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffeb0,
                 (double *)in_stack_fffffffffffffea8,(double *)in_stack_fffffffffffffea0);
    }
    if (*(long *)(local_20 + 0x28) != 0) {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::vector<int,std::allocator<int>>::assign<int*,void>
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
                 (int *)in_stack_fffffffffffffea8,(int *)in_stack_fffffffffffffea0);
    }
    if ((in_RDI[0x12] & 1) == 0) {
      if (*(long *)(local_20 + 8) != 0) {
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        for (local_48 = (pointer)0x0; local_48 < *(pointer *)(local_20 + 8);
            local_48 = (pointer)((long)local_48 + 1)) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),
                              (size_type)local_48);
          vVar9 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),
                              (size_type)local_48);
          dVar7 = vVar9 - *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x13),
                              (size_type)local_48);
          *pvVar3 = dVar7;
        }
      }
      if (*(long *)(local_20 + 0x28) != 0) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
    }
  }
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::initialize_bdens(const InputData &input_data,
                                         const ModelParams &model_params,
                                         std::vector<size_t> &ix_arr,
                                         ColumnSampler<ldouble_safe> &col_sampler)
{
    this->fast_bratio = model_params.fast_bratio;
    if (this->fast_bratio)
    {
        this->multipliers.reserve(model_params.max_depth + 3);
        this->multipliers.push_back(0);
    }

    if (input_data.range_low != NULL || input_data.ncat_ != NULL)
    {
        if (input_data.ncols_numeric)
        {
            this->queue_box.reserve(model_params.max_depth+3);
            this->box_low.assign(input_data.range_low, input_data.range_low + input_data.ncols_numeric);
            this->box_high.assign(input_data.range_high, input_data.range_high + input_data.ncols_numeric);
        }

        if (input_data.ncols_categ)
        {
            this->queue_ncat.reserve(model_params.max_depth+2);
            this->ncat.assign(input_data.ncat_, input_data.ncat_ + input_data.ncols_categ);
        }

        if (!this->fast_bratio)
        {
            if (input_data.ncols_numeric)
            {
                this->ranges.resize(input_data.ncols_numeric);
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                    this->ranges[col] = this->box_high[col] - this->box_low[col];
            }

            if (input_data.ncols_categ)
            {
                this->ncat_orig = this->ncat;
            }
        }

        return;
    }

    if (input_data.ncols_numeric)
    {
        this->queue_box.reserve(model_params.max_depth+3);
        this->box_low.resize(input_data.ncols_numeric);
        this->box_high.resize(input_data.ncols_numeric);
        if (!this->fast_bratio)
            this->ranges.resize(input_data.ncols_numeric);
    }
    if (input_data.ncols_categ)
    {
        this->queue_ncat.reserve(model_params.max_depth+2);
    }
    bool unsplittable = false;
    
    size_t npresent = 0;
    std::vector<signed char> categ_present;
    if (input_data.ncols_categ)
    {
        categ_present.resize(input_data.max_categ);
    }


    col_sampler.prepare_full_pass();
    size_t col;
    while (col_sampler.sample_col(col))
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr != NULL)
            {
                get_range((size_t*)ix_arr.data(), (size_t)0, ix_arr.size()-(size_t)1, col,
                          input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }

            else
            {
                get_range((size_t*)ix_arr.data(), input_data.numeric_data + input_data.nrows * col, (size_t)0, ix_arr.size()-(size_t)1,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }


            if (unsplittable)
            {
                this->box_low[col] = 0;
                this->box_high[col] = 0;
                if (!this->fast_bratio)
                    this->ranges[col] = 0;
                col_sampler.drop_col(col);
            }

            if (!this->fast_bratio)
            {
                this->ranges[col] = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
                this->ranges[col] = std::fmax(this->ranges[col], (ldouble_safe)0);
            }
        }

        else
        {
            get_categs((size_t*)ix_arr.data(),
                       input_data.categ_data + input_data.nrows * (col - input_data.ncols_numeric),
                       (size_t)0, ix_arr.size()-(size_t)1, input_data.ncat[col],
                       model_params.missing_action, categ_present.data(), npresent, unsplittable);

            if (unsplittable)
            {
                this->ncat[col - input_data.ncols_numeric] = 1;
                col_sampler.drop_col(col);
            }

            else
            {
                this->ncat[col - input_data.ncols_numeric] = npresent;
            }
        }
    }

    if (!this->fast_bratio)
        this->ncat_orig = this->ncat;
}